

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations2Plane1Line<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *Pi1,
            Matrix<double,_4,_1,_0,_4,_1> *Pi2,Matrix<double,_4,_1,_0,_4,_1> *Nu1,
            Matrix<double,_4,_1,_0,_4,_1> *Nu2,bool verbose)

{
  iterator iVar1;
  undefined8 uVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  char *__function;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar8;
  iterator iVar9;
  undefined3 in_register_00000089;
  undefined8 *puVar10;
  byte bVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Matrix<double,_3,_1,_0,_3,_1> auxT;
  Matrix<double,_4,_4,_0,_4,_4> auxTrans;
  Matrix<double,_3,_3,_0,_3,_3> auxRot;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_318;
  double local_2f8;
  ulong uStack_2f0;
  double local_2e8;
  ulong uStack_2e0;
  double local_2d0;
  undefined1 local_2c8 [16];
  double local_2b0;
  double local_2a8;
  undefined4 local_29c;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  double local_268;
  ulong uStack_260;
  double local_258;
  ulong uStack_250;
  undefined1 local_248 [16];
  double local_238;
  double local_230;
  undefined1 local_228 [16];
  double local_218;
  ulong uStack_210;
  undefined1 local_208 [16];
  double local_1f8;
  double local_1f0;
  double local_1e8;
  ulong uStack_1e0;
  double local_1d8;
  ulong uStack_1d0;
  double local_1c8;
  ulong uStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_198;
  ulong uStack_190;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  double local_118 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_108;
  double local_88;
  undefined8 uStack_80;
  double local_78 [2];
  undefined8 local_68 [7];
  
  local_29c = CONCAT31(in_register_00000089,verbose);
  bVar11 = 0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8._0_8_ =
       (Pi1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[0]
  ;
  local_218 = (Pi1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  local_118[0] = (Pi1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
                 m_data.array[2];
  dVar14 = (Pi2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[0];
  local_258 = (Pi2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  dVar15 = (Pi2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[2];
  local_128 = local_118[0] * local_118[0];
  local_138 = local_218 * local_218;
  local_2e8 = local_138 + local_128;
  local_298._8_8_ = local_298._0_8_;
  local_298._0_8_ = dVar14;
  local_88 = (double)(local_2c8._0_8_ ^ (ulong)DAT_00226130);
  uStack_80 = DAT_00226130._8_8_;
  local_228._8_8_ = 0;
  local_228._0_8_ = local_218 * local_88;
  local_208._8_8_ = 0;
  local_208._0_8_ = local_118[0] * local_88;
  local_248._0_8_ =
       local_118[0] * local_88 * dVar15 +
       local_218 * local_88 * local_258 + local_138 * dVar14 + local_128 * dVar14;
  uStack_210 = 0;
  local_278._8_8_ = local_278._0_8_;
  local_278._0_8_ = dVar15;
  dVar16 = local_218 * dVar15 - local_258 * local_118[0];
  local_248._8_8_ = 0;
  local_2c8._8_8_ = 0;
  local_268 = (double)local_2c8._0_8_ * (double)local_2c8._0_8_;
  uStack_260 = 0;
  uStack_130 = 0;
  uStack_120 = 0;
  dVar13 = local_268 + local_138 + local_128;
  uStack_2e0 = 0;
  local_2f8 = (double)local_248._0_8_ * (double)local_248._0_8_ * local_2e8 +
              dVar16 * dVar16 * local_2e8 * dVar13;
  local_118[1] = 0.0;
  local_288._8_4_ = DAT_00226130._8_4_;
  local_288._0_8_ = (ulong)local_118[0] ^ (ulong)DAT_00226130;
  local_288._12_4_ = DAT_00226130._12_4_;
  local_1f0 = (Pi1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_170 = (Pi2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_1c8 = (Nu1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0];
  uStack_1c0 = 0;
  local_1d8 = (Nu1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  uStack_1d0 = 0;
  local_198 = (Nu1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2];
  uStack_190 = 0;
  local_1f8 = (Nu1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_2d0 = (Nu2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[0];
  local_2b0 = (Nu2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  local_2a8 = (Nu2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[2];
  local_178 = (Nu2->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  dVar14 = SQRT(local_2f8);
  uStack_2f0 = 0;
  dVar15 = dVar14;
  if (local_2f8 < 0.0) {
    uStack_1e0 = 0;
    local_1e8 = dVar16;
    local_180 = dVar14;
    dVar14 = sqrt(local_2f8);
    dVar15 = local_180;
    dVar16 = local_1e8;
  }
  local_78[0] = dVar16 * (1.0 / dVar14) * local_2e8;
  local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)local_78;
  local_318.m_row = 0;
  local_318.m_col = 1;
  local_318.m_currentBlockRows = 1;
  if (local_2f8 < 0.0) {
    dVar15 = sqrt(local_2f8);
  }
  local_230 = ((double)local_2c8._0_8_ * (double)local_278._0_8_ +
              (double)local_298._0_8_ * (double)local_288._0_8_) * (-1.0 / dVar15) * local_2e8;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_318,&local_230);
  if (local_2f8 < 0.0) {
    dVar14 = sqrt(local_2f8);
  }
  else {
    dVar14 = SQRT(local_2f8);
  }
  local_238 = ((double)local_2c8._0_8_ * local_258 - (double)local_298._0_8_ * local_218) *
              (1.0 / dVar14) * local_2e8;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_238);
  if (local_2f8 < 0.0) {
    dVar14 = sqrt(local_2f8);
  }
  else {
    dVar14 = SQRT(local_2f8);
  }
  dVar13 = SQRT(dVar13);
  local_140 = (double)local_248._0_8_ * (((-1.0 / dVar14) * local_2e8) / dVar13);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_140);
  local_1e8 = -local_218;
  uStack_1e0 = uStack_210 ^ 0x8000000000000000;
  if (local_2f8 < 0.0) {
    dVar14 = sqrt(local_2f8);
  }
  else {
    dVar14 = SQRT(local_2f8);
  }
  uVar12 = local_228._12_4_;
  dVar15 = local_228._0_8_ * (double)local_298._0_8_;
  local_228._8_4_ = local_228._8_4_;
  local_228._0_8_ = dVar15;
  local_228._12_4_ = uVar12;
  local_248._8_4_ = SUB84(local_118[1],0);
  local_248._0_8_ = local_118[0] * local_1e8;
  local_248._12_4_ = (int)((ulong)local_118[1] >> 0x20);
  local_148 = (local_118[0] * local_1e8 * (double)local_278._0_8_ +
              local_268 * local_258 + local_128 * local_258 + dVar15) *
              (((-1.0 / dVar14) * local_2e8) / dVar13);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_148);
  if (local_2f8 < 0.0) {
    dVar14 = sqrt(local_2f8);
  }
  else {
    dVar14 = SQRT(local_2f8);
  }
  uVar12 = local_208._12_4_;
  dVar15 = local_208._0_8_ * (double)local_298._0_8_;
  local_208._8_4_ = local_208._8_4_;
  local_208._0_8_ = dVar15;
  local_208._12_4_ = uVar12;
  uVar12 = local_248._12_4_;
  dVar16 = local_248._0_8_ * local_258;
  local_248._8_4_ = local_248._8_4_;
  local_248._0_8_ = dVar16;
  local_248._12_4_ = uVar12;
  local_150 = (local_268 * (double)local_278._0_8_ + local_138 * (double)local_278._0_8_ + dVar15 +
              dVar16) * ((local_2e8 * (-1.0 / dVar14)) / dVar13);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_150);
  local_158 = (double)local_2c8._0_8_ / dVar13;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_158);
  local_160 = local_218 / dVar13;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_160);
  local_168 = local_118[0] / dVar13;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_168);
  if (((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
       (local_318.m_row + local_318.m_currentBlockRows) ==
       (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x3) && (local_318.m_col == 3)) {
    dVar14 = (double)local_248._0_8_ * (double)local_278._0_8_ +
             (double)local_248._0_8_ * (double)local_278._0_8_ +
             (double)local_208._0_8_ * (double)local_278._0_8_ +
             (double)local_208._0_8_ * (double)local_278._0_8_ +
             (double)local_228._0_8_ * local_258 + (double)local_228._0_8_ * local_258 +
             local_258 * local_258 * local_128 +
             (double)local_278._0_8_ * (double)local_278._0_8_ * local_138 +
             (double)local_298._0_8_ * (double)local_298._0_8_ * local_128 +
             local_268 * (double)local_278._0_8_ * (double)local_278._0_8_ +
             local_268 * local_258 * local_258 +
             local_138 * (double)local_298._0_8_ * (double)local_298._0_8_;
    local_288._0_8_ =
         ((double)local_288._0_8_ * local_1f0 * (double)local_278._0_8_ +
         local_1e8 * local_1f0 * local_258 +
         local_88 * local_1f0 * (double)local_298._0_8_ +
         local_170 * local_128 + local_268 * local_170 + local_138 * local_170) * (-1.0 / dVar13);
    local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&local_1b8;
    local_318.m_row = 0;
    local_318.m_col = 1;
    local_318.m_currentBlockRows = 1;
    local_1b8 = 0.0;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    local_230 = (double)local_288._0_8_ / dVar14;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_318,
                        &local_230);
    local_238 = local_1f0 / dVar13;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_238);
    if (((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
         (local_318.m_row + local_318.m_currentBlockRows) ==
         (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x3) && (local_318.m_col == 1)) {
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = 1.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      lVar5 = 0x10;
      puVar10 = local_68;
      puVar7 = puVar10;
      do {
        uVar2 = puVar7[-1];
        *(undefined8 *)((long)local_118 + lVar5) = puVar7[-2];
        *(undefined8 *)
         ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar5 + -8) = uVar2;
        *(undefined8 *)
         ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar5) = *puVar7;
        puVar7 = puVar7 + 3;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0x70);
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_1b8;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = dStack_1b0;
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_1a8;
      if ((char)local_29c != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar6 = (ostream *)std::ostream::flush();
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                          &local_108);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar6 = (ostream *)std::ostream::flush();
        local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&local_108;
        local_318.m_row = (Index)&local_108;
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                                           *)&local_318);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,iVar1,&local_108);
      }
      else {
        pMVar8 = &local_108;
        iVar9._M_current = iVar1._M_current;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar8 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar8 + ((ulong)bVar11 * -2 + 1) * 8);
          iVar9._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar9._M_current + ((ulong)bVar11 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_218 = local_198 * local_198;
      local_228._0_8_ = local_1d8 * local_1d8;
      local_2e8 = (double)local_228._0_8_ + local_218;
      local_208._0_8_ = -local_1c8;
      local_278._8_4_ = (int)uStack_1d0;
      local_278._0_8_ = local_1d8 * (double)local_208._0_8_;
      local_278._12_4_ = (int)(uStack_1d0 >> 0x20);
      local_208._8_8_ = uStack_1c0 ^ 0x8000000000000000;
      local_288._8_8_ = uStack_190;
      local_288._0_8_ = local_198 * (double)local_208._0_8_;
      dVar16 = local_198 * (double)local_208._0_8_ * local_2a8 +
               local_1d8 * (double)local_208._0_8_ * local_2b0 +
               (double)local_228._0_8_ * local_2d0 + local_218 * local_2d0;
      local_298._8_4_ = (int)uStack_190;
      local_298._0_8_ = -local_198;
      local_298._12_4_ = (uint)(uStack_190 >> 0x20) ^ 0x80000000;
      dVar13 = local_1d8 * local_2a8 - local_2b0 * local_198;
      local_258 = local_1c8 * local_1c8;
      uStack_250 = uStack_1c0;
      local_228._8_8_ = uStack_1d0;
      uStack_210 = uStack_190;
      local_2c8._0_8_ = local_258 + (double)local_228._0_8_ + local_218;
      local_2c8._8_8_ = uStack_1c0;
      uStack_2e0 = uStack_1d0;
      local_2f8 = dVar16 * dVar16 * local_2e8 +
                  dVar13 * dVar13 * local_2e8 * (double)local_2c8._0_8_;
      dVar14 = SQRT(local_2f8);
      uStack_2f0 = uStack_190;
      dVar15 = dVar14;
      if (local_2f8 < 0.0) {
        uStack_260 = uStack_1d0;
        local_248._0_8_ = dVar14;
        local_268 = dVar13;
        dVar14 = sqrt(local_2f8);
        dVar13 = local_268;
        dVar15 = (double)local_248._0_8_;
      }
      local_78[0] = dVar13 * (1.0 / dVar14) * local_2e8;
      local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)local_78;
      local_318.m_row = 0;
      local_318.m_col = 1;
      local_318.m_currentBlockRows = 1;
      if (local_2f8 < 0.0) {
        dVar15 = sqrt(local_2f8);
      }
      local_230 = (local_1c8 * local_2a8 + local_2d0 * (double)local_298._0_8_) * (-1.0 / dVar15) *
                  local_2e8;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (&local_318,&local_230);
      if (local_2f8 < 0.0) {
        dVar14 = sqrt(local_2f8);
      }
      else {
        dVar14 = SQRT(local_2f8);
      }
      local_238 = (local_1c8 * local_2b0 - local_2d0 * local_1d8) * (1.0 / dVar14) * local_2e8;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_238);
      if (local_2f8 < 0.0) {
        dVar14 = sqrt(local_2f8);
      }
      else {
        dVar14 = SQRT(local_2f8);
      }
      dVar15 = SQRT((double)local_2c8._0_8_);
      local_140 = dVar16 * (((-1.0 / dVar14) * local_2e8) / dVar15);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_140);
      local_268 = -local_1d8;
      uStack_260 = uStack_1d0 ^ 0x8000000000000000;
      if (local_2f8 < 0.0) {
        dVar14 = sqrt(local_2f8);
      }
      else {
        dVar14 = SQRT(local_2f8);
      }
      local_278._0_8_ = (double)local_278._0_8_ * local_2d0;
      local_2c8._8_4_ = (int)uStack_190;
      local_2c8._0_8_ = local_198 * local_268;
      local_2c8._12_4_ = (int)(uStack_190 >> 0x20);
      local_148 = (local_198 * local_268 * local_2a8 +
                  local_258 * local_2b0 + local_218 * local_2b0 + (double)local_278._0_8_) *
                  (((-1.0 / dVar14) * local_2e8) / dVar15);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_148);
      if (local_2f8 < 0.0) {
        dVar14 = sqrt(local_2f8);
      }
      else {
        dVar14 = SQRT(local_2f8);
      }
      local_288._0_8_ = (double)local_288._0_8_ * local_2d0;
      local_2c8._0_8_ = (double)local_2c8._0_8_ * local_2b0;
      local_150 = (local_258 * local_2a8 + (double)local_228._0_8_ * local_2a8 +
                   (double)local_288._0_8_ + (double)local_2c8._0_8_) *
                  ((local_2e8 * (-1.0 / dVar14)) / dVar15);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_150);
      local_158 = local_1c8 / dVar15;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_158);
      local_160 = local_1d8 / dVar15;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_160);
      local_168 = local_198 / dVar15;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_168);
      if (((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
           (local_318.m_row + local_318.m_currentBlockRows) !=
           (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x3) || (local_318.m_col != 3))
      goto LAB_001495bd;
      uVar12 = local_298._12_4_;
      local_298._8_4_ = local_298._8_4_;
      local_298._0_8_ =
           (local_298._0_8_ * local_1f8 * local_2a8 +
           local_268 * local_1f8 * local_2b0 +
           (double)local_208._0_8_ * local_1f8 * local_2d0 +
           local_178 * local_218 + local_258 * local_178 + (double)local_228._0_8_ * local_178) *
           (-1.0 / dVar15);
      local_298._12_4_ = uVar12;
      dVar14 = (double)local_2c8._0_8_ * local_2a8 + (double)local_2c8._0_8_ * local_2a8 +
               (double)local_288._0_8_ * local_2a8 + (double)local_288._0_8_ * local_2a8 +
               (double)local_278._0_8_ * local_2b0 + (double)local_278._0_8_ * local_2b0 +
               local_2b0 * local_2b0 * local_218 +
               local_2a8 * local_2a8 * (double)local_228._0_8_ +
               local_2d0 * local_2d0 * local_218 +
               local_258 * local_2a8 * local_2a8 +
               local_258 * local_2b0 * local_2b0 + (double)local_228._0_8_ * local_2d0 * local_2d0;
      local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&local_1b8;
      local_318.m_row = 0;
      local_318.m_col = 1;
      local_318.m_currentBlockRows = 1;
      local_1b8 = 0.0;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      local_230 = (double)local_298._0_8_ / dVar14;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_318,
                          &local_230);
      local_238 = local_1f8 / dVar15;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_238);
      if (((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
           (local_318.m_row + local_318.m_currentBlockRows) ==
           (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)0x3) && (local_318.m_col == 1)) {
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = 1.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 1.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 1.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = 0.0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = 1.0;
        lVar5 = 0x10;
        do {
          uVar2 = puVar10[-1];
          *(undefined8 *)((long)local_118 + lVar5) = puVar10[-2];
          *(undefined8 *)
           ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar5 + -8) = uVar2;
          *(undefined8 *)
           ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar5) = *puVar10;
          puVar10 = puVar10 + 3;
          lVar5 = lVar5 + 0x20;
        } while (lVar5 != 0x70);
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = local_1b8;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = dStack_1b0;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = local_1a8;
        if ((char)local_29c != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar6 = (ostream *)std::ostream::flush();
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                            &local_108);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar6 = (ostream *)std::ostream::flush();
          local_318.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)&local_108;
          local_318.m_row = (Index)&local_108;
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                                             *)&local_318);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>::
          _M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                    ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                      *)__return_storage_ptr__,iVar1,&local_108);
        }
        else {
          pMVar8 = &local_108;
          iVar9._M_current = iVar1._M_current;
          for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
            ((iVar9._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0] =
                 (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
            pMVar8 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar8 + ((ulong)bVar11 * -2 + 1) * 8);
            iVar9._M_current =
                 (Matrix<double,_4,_4,_0,_4,_4> *)
                 ((long)iVar9._M_current + ((ulong)bVar11 * -2 + 1) * 8);
          }
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        return __return_storage_ptr__;
      }
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
    ;
  }
  else {
LAB_001495bd:
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations2Plane1Line(
	Matrix<floatPrec, 4, 1> Pi1, Matrix<floatPrec, 4, 1> Pi2,
	Matrix<floatPrec, 4, 1> Nu1, Matrix<floatPrec, 4, 1> Nu2,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec pi21, pi22, pi23, pi24;
	floatPrec nu11, nu12, nu13, nu14;
	floatPrec nu21, nu22, nu23, nu24;

	pi11 = Pi1(0);
	pi12 = Pi1(1);
	pi13 = Pi1(2);
	pi14 = Pi1(3);
	pi21 = Pi2(0);
	pi22 = Pi2(1);
	pi23 = Pi2(2);
	pi24 = Pi2(3);
	nu11 = Nu1(0);
	nu12 = Nu1(1);
	nu13 = Nu1(2);
	nu14 = Nu1(3);
	nu21 = Nu2(0);
	nu22 = Nu2(1);
	nu23 = Nu2(2);
	nu24 = Nu2(3);

	// Compute U Matrix
	auxRot << 1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi23 - pi13 * pi22) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi23 - pi13 * pi21) * (pi12 * pi12 + pi13 * pi13),
		1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi22 - pi12 * pi21) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi22 + (pi13 * pi13) * pi22 - pi11 * pi12 * pi21 - pi12 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi23 + (pi12 * pi12) * pi23 - pi11 * pi13 * pi21 - pi12 * pi13 * pi22),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0,
		-1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi24 + (pi12 * pi12) * pi24 + (pi13 * pi13) * pi24 - pi11 * pi14 * pi21 - pi12 * pi14 * pi22 - pi13 * pi14 * pi23) * 1.0 / sqrt((pi11 * pi11) * (pi22 * pi22) + (pi12 * pi12) * (pi21 * pi21) + (pi11 * pi11) * (pi23 * pi23) + (pi13 * pi13) * (pi21 * pi21) + (pi12 * pi12) * (pi23 * pi23) + (pi13 * pi13) * (pi22 * pi22) - pi11 * pi12 * pi21 * pi22 * 2.0 - pi11 * pi13 * pi21 * pi23 * 2.0 - pi12 * pi13 * pi22 * pi23 * 2.0),
		pi14 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu23 - nu13 * nu22) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu23 - nu13 * nu21) * (nu12 * nu12 + nu13 * nu13),
		1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu22 - nu12 * nu21) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu22 + (nu13 * nu13) * nu22 - nu11 * nu12 * nu21 - nu12 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu23 + (nu12 * nu12) * nu23 - nu11 * nu13 * nu21 - nu12 * nu13 * nu22),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0,
		-1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu24 + (nu12 * nu12) * nu24 + (nu13 * nu13) * nu24 - nu11 * nu14 * nu21 - nu12 * nu14 * nu22 - nu13 * nu14 * nu23) * 1.0 / sqrt((nu11 * nu11) * (nu22 * nu22) + (nu12 * nu12) * (nu21 * nu21) + (nu11 * nu11) * (nu23 * nu23) + (nu13 * nu13) * (nu21 * nu21) + (nu12 * nu12) * (nu23 * nu23) + (nu13 * nu13) * (nu22 * nu22) - nu11 * nu12 * nu21 * nu22 * 2.0 - nu11 * nu13 * nu21 * nu23 * 2.0 - nu12 * nu13 * nu22 * nu23 * 2.0),
		nu14 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}